

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O3

void do_crop(j_decompress_ptr srcinfo,j_compress_ptr dstinfo,JDIMENSION x_crop_offset,
            JDIMENSION y_crop_offset,jvirt_barray_ptr *src_coef_arrays,
            jvirt_barray_ptr *dst_coef_arrays)

{
  uint uVar1;
  jpeg_component_info *pjVar2;
  int iVar3;
  JBLOCKARRAY ppaJVar4;
  JBLOCKARRAY ppaJVar5;
  ulong uVar6;
  JDIMENSION JVar7;
  long lVar8;
  long lVar9;
  
  iVar3 = dstinfo->num_components;
  if (0 < iVar3) {
    lVar9 = 0;
    do {
      pjVar2 = dstinfo->comp_info;
      if (pjVar2[lVar9].height_in_blocks != 0) {
        uVar1 = pjVar2[lVar9].v_samp_factor;
        uVar6 = (ulong)uVar1;
        iVar3 = pjVar2[lVar9].h_samp_factor;
        JVar7 = 0;
        do {
          ppaJVar4 = (*srcinfo->mem->access_virt_barray)
                               ((j_common_ptr)srcinfo,dst_coef_arrays[lVar9],JVar7,(JDIMENSION)uVar6
                                ,1);
          ppaJVar5 = (*srcinfo->mem->access_virt_barray)
                               ((j_common_ptr)srcinfo,src_coef_arrays[lVar9],
                                uVar1 * y_crop_offset + JVar7,pjVar2[lVar9].v_samp_factor,0);
          uVar6 = (ulong)(uint)pjVar2[lVar9].v_samp_factor;
          if (0 < pjVar2[lVar9].v_samp_factor) {
            lVar8 = 0;
            do {
              jcopy_block_row(ppaJVar5[lVar8] + iVar3 * x_crop_offset,ppaJVar4[lVar8],
                              pjVar2[lVar9].width_in_blocks);
              lVar8 = lVar8 + 1;
              uVar6 = (ulong)pjVar2[lVar9].v_samp_factor;
            } while (lVar8 < (long)uVar6);
          }
          JVar7 = JVar7 + (int)uVar6;
        } while (JVar7 < pjVar2[lVar9].height_in_blocks);
        iVar3 = dstinfo->num_components;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar3);
  }
  return;
}

Assistant:

LOCAL(void)
do_crop(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
        JDIMENSION x_crop_offset, JDIMENSION y_crop_offset,
        jvirt_barray_ptr *src_coef_arrays,
        jvirt_barray_ptr *dst_coef_arrays)
/* Crop.  This is only used when no rotate/flip is requested with the crop. */
{
  JDIMENSION dst_blk_y, x_crop_blocks, y_crop_blocks;
  int ci, offset_y;
  JBLOCKARRAY src_buffer, dst_buffer;
  jpeg_component_info *compptr;

  /* We simply have to copy the right amount of data (the destination's
   * image size) starting at the given X and Y offsets in the source.
   */
  for (ci = 0; ci < dstinfo->num_components; ci++) {
    compptr = dstinfo->comp_info + ci;
    x_crop_blocks = x_crop_offset * compptr->h_samp_factor;
    y_crop_blocks = y_crop_offset * compptr->v_samp_factor;
    for (dst_blk_y = 0; dst_blk_y < compptr->height_in_blocks;
         dst_blk_y += compptr->v_samp_factor) {
      dst_buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, dst_coef_arrays[ci], dst_blk_y,
         (JDIMENSION)compptr->v_samp_factor, TRUE);
      src_buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, src_coef_arrays[ci], dst_blk_y + y_crop_blocks,
         (JDIMENSION)compptr->v_samp_factor, FALSE);
      for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
        jcopy_block_row(src_buffer[offset_y] + x_crop_blocks,
                        dst_buffer[offset_y], compptr->width_in_blocks);
      }
    }
  }
}